

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O0

void __thiscall BSTree<int>::destroy(BSTree<int> *this,BSTNode<int> **tree)

{
  BSTNode<int> **tree_local;
  BSTree<int> *this_local;
  
  if (*tree != (BSTNode<int> *)0x0) {
    if ((*tree)->left == (BSTNode<int> *)0x0) {
      if ((*tree)->right == (BSTNode<int> *)0x0) {
        if (*tree != (BSTNode<int> *)0x0) {
          operator_delete(*tree,0x20);
        }
        *tree = (BSTNode<int> *)0x0;
      }
      else {
        destroy(this,&(*tree)->right);
      }
    }
    else {
      destroy(this,&(*tree)->left);
    }
  }
  return;
}

Assistant:

void BSTree<T>::destroy(BSTNode<T>* &tree)
{
	if (tree == nullptr)
		return;

	if (tree->left != nullptr)
		return destroy(tree->left);

	if (tree->right != nullptr)
		return destroy(tree->right);

	delete tree;

	tree = nullptr;
}